

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_main_main.cpp
# Opt level: O0

int sc_elab_and_sim(int argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  reference ppcVar4;
  ostream *poVar5;
  long in_RSI;
  int in_EDI;
  char CODENL [4];
  char MSGNL [15];
  stringstream ss;
  int i_1;
  sc_report *x;
  sc_report *err_p;
  vector<char_*,_std::allocator<char_*>_> argv_call;
  size_t size;
  int i;
  vector<char_*,_std::allocator<char_*>_> argv_copy;
  int status;
  char *in_stack_fffffffffffffca0;
  allocator_type *in_stack_fffffffffffffca8;
  value_type *in_stack_fffffffffffffcb0;
  size_type in_stack_fffffffffffffcb8;
  ostream *in_stack_fffffffffffffcc0;
  vector<char_*,_std::allocator<char_*>_> *in_stack_fffffffffffffce8;
  vector<char_*,_std::allocator<char_*>_> *in_stack_fffffffffffffcf0;
  char *in_stack_fffffffffffffd18;
  char *in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd28;
  sc_severity in_stack_fffffffffffffd34;
  string local_250 [36];
  char local_22c [20];
  stringstream local_218 [16];
  ostream local_208 [376];
  int local_90;
  vector<char_*,_std::allocator<char_*>_> local_70;
  ulong local_58;
  int local_50;
  undefined8 local_38;
  vector<char_*,_std::allocator<char_*>_> local_30;
  int local_14;
  long local_10;
  int local_4;
  
  local_14 = 1;
  local_38 = 0;
  sc_core::argc_orig = in_EDI;
  sc_core::argv_orig = in_RSI;
  local_10 = in_RSI;
  local_4 = in_EDI;
  std::allocator<char_*>::allocator((allocator<char_*> *)0x2a8f71);
  std::vector<char_*,_std::allocator<char_*>_>::vector
            ((vector<char_*,_std::allocator<char_*>_> *)in_stack_fffffffffffffcc0,
             in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  std::allocator<char_*>::~allocator((allocator<char_*> *)0x2a8fa5);
  for (local_50 = 0; local_50 < local_4; local_50 = local_50 + 1) {
    sVar2 = strlen(*(char **)(local_10 + (long)local_50 * 8));
    local_58 = sVar2 + 1;
    pcVar3 = (char *)operator_new__(local_58);
    ppcVar4 = std::vector<char_*,_std::allocator<char_*>_>::operator[](&local_30,(long)local_50);
    *ppcVar4 = pcVar3;
    std::vector<char_*,_std::allocator<char_*>_>::operator[](&local_30,(long)local_50);
    std::copy<char*,char*>
              ((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,
               in_stack_fffffffffffffca0);
  }
  sc_core::pln();
  sc_core::sc_in_action = 1;
  std::vector<char_*,_std::allocator<char_*>_>::vector
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  iVar1 = local_4;
  ppcVar4 = std::vector<char_*,_std::allocator<char_*>_>::operator[](&local_70,0);
  local_14 = sc_main(iVar1,ppcVar4);
  sc_core::sc_in_action = 0;
  std::vector<char_*,_std::allocator<char_*>_>::~vector
            ((vector<char_*,_std::allocator<char_*>_> *)in_stack_fffffffffffffcc0);
  for (local_90 = 0; local_90 < local_4; local_90 = local_90 + 1) {
    ppcVar4 = std::vector<char_*,_std::allocator<char_*>_>::operator[](&local_30,(long)local_90);
    if (*ppcVar4 != (char *)0x0) {
      operator_delete__(*ppcVar4);
    }
  }
  iVar1 = sc_core::sc_report_handler::get_count(in_stack_fffffffffffffca0);
  if (0 < iVar1) {
    std::__cxx11::stringstream::stringstream(local_218);
    builtin_strncpy(local_22c + 4,"\n             ",0xf);
    builtin_strncpy(local_22c,"\n  ",4);
    poVar5 = std::operator<<(local_208,"You can turn off warnings about");
    poVar5 = std::operator<<(poVar5,local_22c + 4);
    poVar5 = std::operator<<(poVar5,"IEEE 1666 deprecated features by placing this method call");
    poVar5 = std::operator<<(poVar5,local_22c + 4);
    poVar5 = std::operator<<(poVar5,"as the first statement in your sc_main() function:\n");
    poVar5 = std::operator<<(poVar5,local_22c);
    poVar5 = std::operator<<(poVar5,"sc_core::sc_report_handler::set_actions( ");
    poVar5 = std::operator<<(poVar5,"\"");
    poVar5 = std::operator<<(poVar5,"/IEEE_Std_1666/deprecated");
    in_stack_fffffffffffffcc0 = std::operator<<(poVar5,"\",");
    poVar5 = std::operator<<(in_stack_fffffffffffffcc0,local_22c);
    poVar5 = std::operator<<(poVar5,"                                         ");
    poVar5 = std::operator<<(poVar5,"sc_core::SC_DO_NOTHING );");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    sc_core::sc_report_handler::report
              (in_stack_fffffffffffffd34,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
               in_stack_fffffffffffffd18,iVar1);
    std::__cxx11::string::~string(local_250);
    std::__cxx11::stringstream::~stringstream(local_218);
  }
  iVar1 = local_14;
  std::vector<char_*,_std::allocator<char_*>_>::~vector
            ((vector<char_*,_std::allocator<char_*>_> *)in_stack_fffffffffffffcc0);
  return iVar1;
}

Assistant:

int
sc_elab_and_sim( int argc, char* argv[] )
{
    int status = 1;
    argc_orig = argc;
    argv_orig = argv;

    // Copy argv into a new structure to prevent sc_main from modifying the
    // result returned from sc_argv.
    std::vector<char*> argv_copy(argc + 1, static_cast<char*>(NULL));
    for ( int i = 0; i < argc; ++i ) {
        std::size_t size = std::strlen(argv[i]) + 1;
        argv_copy[i] = new char[size];
        std::copy(argv[i], argv[i] + size, argv_copy[i]);
    }

    try
    {
        pln();

        // Perform initialization here
        sc_in_action = true;

        // copy array of pointers to keep allocated pointers for later release
        std::vector<char*> argv_call = argv_copy;
        status = sc_main( argc, &argv_call[0] );

        // Perform cleanup here
        sc_in_action = false;
    }
    catch( const sc_report& x )
    {
        sc_report_handler::get_handler()
            ( x, sc_report_handler::get_catch_actions() );
    }
    catch( ... )
    {
        // translate other escaping exceptions
        sc_report*  err_p = sc_handle_exception();
        if( err_p )
            sc_report_handler::get_handler()
                ( *err_p, sc_report_handler::get_catch_actions() );
        delete err_p;
    }

    for ( int i = 0; i < argc; ++i ) {
        delete[] argv_copy[i];
    }

    // IF DEPRECATION WARNINGS WERE ISSUED TELL THE USER HOW TO TURN THEM OFF

    if ( sc_report_handler::get_count( SC_ID_IEEE_1666_DEPRECATION_ ) > 0 )
    {
        std::stringstream ss;

        const char MSGNL[] = "\n             ";
        const char CODENL[] = "\n  ";

        ss << "You can turn off warnings about" << MSGNL
           << "IEEE 1666 deprecated features by placing this method call" << MSGNL
           << "as the first statement in your sc_main() function:\n" << CODENL
           << "sc_core::sc_report_handler::set_actions( "
           << "\"" << SC_ID_IEEE_1666_DEPRECATION_ << "\"," << CODENL
           << "                                         " /* indent param */
           << "sc_core::SC_DO_NOTHING );"
           << std::endl;

        SC_REPORT_INFO( SC_ID_IEEE_1666_DEPRECATION_, ss.str().c_str() );
    }

    return status;
}